

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O2

void x11_format_auth_for_authfile
               (BinarySink *bs,SockAddr *addr,int display_no,ptrlen authproto,ptrlen authdata)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  BinarySink *pBVar4;
  ptrlen pVar5;
  size_t sStack_60;
  char ipv4buf [4];
  
  _Var1 = sk_address_is_special_local(addr);
  if (_Var1) {
    pcVar3 = get_hostname();
    BinarySink_put_uint16(bs->binarysink_,0x100);
    pBVar4 = bs->binarysink_;
    pVar5 = ptrlen_from_asciz(pcVar3);
    BinarySink_put_stringpl_xauth(pBVar4,pVar5);
    safefree(pcVar3);
  }
  else {
    iVar2 = sk_addrtype(addr);
    if (iVar2 == 1) {
      sk_addrcopy(addr,ipv4buf);
      BinarySink_put_uint16(bs->binarysink_,0);
      pBVar4 = bs->binarysink_;
      sStack_60 = 4;
    }
    else {
      iVar2 = sk_addrtype(addr);
      if (iVar2 != 2) {
        __assert_fail("false && \"Bad address type in x11_format_auth_for_authfile\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/x11authfile.c"
                      ,0xe9,
                      "void x11_format_auth_for_authfile(BinarySink *, SockAddr *, int, ptrlen, ptrlen)"
                     );
      }
      sk_addrcopy(addr,ipv4buf);
      BinarySink_put_uint16(bs->binarysink_,6);
      pBVar4 = bs->binarysink_;
      sStack_60 = 0x10;
    }
    pVar5.len = sStack_60;
    pVar5.ptr = ipv4buf;
    BinarySink_put_stringpl_xauth(pBVar4,pVar5);
  }
  pcVar3 = dupprintf("%d",(ulong)(uint)display_no);
  pBVar4 = bs->binarysink_;
  pVar5 = ptrlen_from_asciz(pcVar3);
  BinarySink_put_stringpl_xauth(pBVar4,pVar5);
  safefree(pcVar3);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authproto);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authdata);
  return;
}

Assistant:

void x11_format_auth_for_authfile(
    BinarySink *bs, SockAddr *addr, int display_no,
    ptrlen authproto, ptrlen authdata)
{
    if (sk_address_is_special_local(addr)) {
        char *ourhostname = get_hostname();
        put_uint16(bs, 256); /* indicates Unix-domain socket */
        put_stringpl_xauth(bs, ptrlen_from_asciz(ourhostname));
        sfree(ourhostname);
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV4) {
        char ipv4buf[4];
        sk_addrcopy(addr, ipv4buf);
        put_uint16(bs, 0); /* indicates IPv4 */
        put_stringpl_xauth(bs, make_ptrlen(ipv4buf, 4));
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV6) {
        char ipv6buf[16];
        sk_addrcopy(addr, ipv6buf);
        put_uint16(bs, 6); /* indicates IPv6 */
        put_stringpl_xauth(bs, make_ptrlen(ipv6buf, 16));
    } else {
        unreachable("Bad address type in x11_format_auth_for_authfile");
    }

    {
        char *numberbuf = dupprintf("%d", display_no);
        put_stringpl_xauth(bs, ptrlen_from_asciz(numberbuf));
        sfree(numberbuf);
    }

    put_stringpl_xauth(bs, authproto);
    put_stringpl_xauth(bs, authdata);
}